

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O3

void __thiscall
rlottie::internal::renderer::Polystar::updatePath(Polystar *this,VPath *path,int frameNo)

{
  Direction dir;
  Polystar *pPVar1;
  VPathData *pVVar2;
  VMatrix *this_00;
  size_t in_RCX;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int iVar3;
  undefined4 extraout_EDX_06;
  undefined4 extraout_EDX_07;
  undefined4 in_register_00000014;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  int __fd;
  VPath *pVVar4;
  float a;
  float local_70;
  float local_6c;
  float local_68;
  float local_60;
  float local_5c;
  VPointF local_58;
  VMatrix local_48;
  
  pPVar1 = this->mData;
  if ((pPVar1->mPos).isValue_ == true) {
    local_58 = (pPVar1->mPos).impl_.value_;
    iVar3 = frameNo;
    pVVar4 = path;
  }
  else {
    pVVar4 = (VPath *)(ulong)(uint)frameNo;
    local_58 = model::KeyFrames<VPointF,_void>::value((pPVar1->mPos).impl_,frameNo);
    pPVar1 = this->mData;
    iVar3 = extraout_EDX;
    in_register_00000014 = extraout_var;
  }
  __fd = (int)pVVar4;
  if ((pPVar1->mPointCount).isValue_ == true) {
    local_68 = (pPVar1->mPointCount).impl_.value_;
  }
  else {
    __fd = frameNo;
    local_68 = model::KeyFrames<float,_void>::value((pPVar1->mPointCount).impl_,frameNo);
    pPVar1 = this->mData;
    iVar3 = extraout_EDX_00;
    in_register_00000014 = extraout_var_00;
  }
  if ((pPVar1->mInnerRadius).isValue_ == true) {
    local_5c = (pPVar1->mInnerRadius).impl_.value_;
  }
  else {
    __fd = frameNo;
    local_5c = model::KeyFrames<float,_void>::value((pPVar1->mInnerRadius).impl_,frameNo);
    pPVar1 = this->mData;
    iVar3 = extraout_EDX_01;
    in_register_00000014 = extraout_var_01;
  }
  if ((pPVar1->mOuterRadius).isValue_ == true) {
    local_6c = (pPVar1->mOuterRadius).impl_.value_;
  }
  else {
    __fd = frameNo;
    local_6c = model::KeyFrames<float,_void>::value((pPVar1->mOuterRadius).impl_,frameNo);
    pPVar1 = this->mData;
    iVar3 = extraout_EDX_02;
    in_register_00000014 = extraout_var_02;
  }
  if ((pPVar1->mInnerRoundness).isValue_ == true) {
    local_60 = (pPVar1->mInnerRoundness).impl_.value_;
  }
  else {
    __fd = frameNo;
    local_60 = model::KeyFrames<float,_void>::value((pPVar1->mInnerRoundness).impl_,frameNo);
    pPVar1 = this->mData;
    iVar3 = extraout_EDX_03;
    in_register_00000014 = extraout_var_03;
  }
  if ((pPVar1->mOuterRoundness).isValue_ == true) {
    local_70 = (pPVar1->mOuterRoundness).impl_.value_;
  }
  else {
    __fd = frameNo;
    local_70 = model::KeyFrames<float,_void>::value((pPVar1->mOuterRoundness).impl_,frameNo);
    pPVar1 = this->mData;
    iVar3 = extraout_EDX_04;
    in_register_00000014 = extraout_var_04;
  }
  if ((pPVar1->mRotation).isValue_ == true) {
    a = (pPVar1->mRotation).impl_.value_;
  }
  else {
    __fd = frameNo;
    a = model::KeyFrames<float,_void>::value((pPVar1->mRotation).impl_,frameNo);
    iVar3 = extraout_EDX_05;
    in_register_00000014 = extraout_var_05;
  }
  pVVar2 = (VPathData *)
           vcow_ptr<VPath::VPathData>::write
                     (&path->d,__fd,(void *)CONCAT44(in_register_00000014,iVar3),in_RCX);
  VPath::VPathData::reset(pVVar2);
  local_48.m11 = 1.0;
  local_48.m12 = 0.0;
  local_48.m13 = 0.0;
  local_48.m21 = 0.0;
  local_48.m22 = 1.0;
  local_48.m23 = 0.0;
  local_48.mtx = 0.0;
  local_48.mty = 0.0;
  local_48.m33 = 1.0;
  local_48.mType = None;
  local_48.dirty = None;
  iVar3 = *(int *)&(this->mData->super_Shape).field_0x14;
  dir = (Direction)((this->mData->super_Shape).mDirection != 3);
  pVVar2 = (VPathData *)
           vcow_ptr<VPath::VPathData>::write
                     (&path->d,__fd,(void *)CONCAT44(extraout_var_06,extraout_EDX_06),in_RCX);
  if (iVar3 == 1) {
    VPath::VPathData::addPolystar
              (pVVar2,local_68,local_5c,local_6c,local_60,local_70,0.0,0.0,0.0,dir);
  }
  else {
    VPath::VPathData::addPolygon(pVVar2,local_68,local_6c,local_70,0.0,0.0,0.0,dir);
  }
  this_00 = VMatrix::translate(&local_48,local_58.mx,local_58.my);
  VMatrix::rotate(this_00,a,Z);
  iVar3 = 2;
  VMatrix::rotate(&local_48,a,Z);
  pVVar2 = (VPathData *)
           vcow_ptr<VPath::VPathData>::write
                     (&path->d,iVar3,(void *)CONCAT44(extraout_var_07,extraout_EDX_07),in_RCX);
  VPath::VPathData::transform(pVVar2,&local_48);
  return;
}

Assistant:

void renderer::Polystar::updatePath(VPath &path, int frameNo)
{
    VPointF pos = mData->mPos.value(frameNo);
    float   points = mData->mPointCount.value(frameNo);
    float   innerRadius = mData->mInnerRadius.value(frameNo);
    float   outerRadius = mData->mOuterRadius.value(frameNo);
    float   innerRoundness = mData->mInnerRoundness.value(frameNo);
    float   outerRoundness = mData->mOuterRoundness.value(frameNo);
    float   rotation = mData->mRotation.value(frameNo);

    path.reset();
    VMatrix m;

    if (mData->mPolyType == model::Polystar::PolyType::Star) {
        path.addPolystar(points, innerRadius, outerRadius, innerRoundness,
                         outerRoundness, 0.0, 0.0, 0.0, mData->direction());
    } else {
        path.addPolygon(points, outerRadius, outerRoundness, 0.0, 0.0, 0.0,
                        mData->direction());
    }

    m.translate(pos.x(), pos.y()).rotate(rotation);
    m.rotate(rotation);
    path.transform(m);
}